

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_time.cc
# Opt level: O2

int OPENSSL_gmtime_diff(int *out_days,int *out_secs,tm *from,tm *to)

{
  int iVar1;
  int iVar2;
  int64_t time_from;
  int64_t time_to;
  
  iVar1 = OPENSSL_tm_to_posix(to,&time_to);
  iVar2 = 0;
  if (iVar1 != 0) {
    iVar1 = OPENSSL_tm_to_posix(from,&time_from);
    if (iVar1 != 0) {
      *out_secs = (int)((time_to - time_from) % 0x15180);
      *out_days = (int)((time_to - time_from) / 0x15180);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int OPENSSL_gmtime_diff(int *out_days, int *out_secs, const struct tm *from,
                        const struct tm *to) {
  int64_t time_to, time_from;
  if (!OPENSSL_tm_to_posix(to, &time_to) ||
      !OPENSSL_tm_to_posix(from, &time_from)) {
    return 0;
  }
  // Times are in range, so these calculations can not overflow.
  static_assert(SECS_PER_DAY <= INT_MAX, "seconds per day does not fit in int");
  static_assert((MAX_POSIX_TIME - MIN_POSIX_TIME) / SECS_PER_DAY <= INT_MAX,
                "range of valid POSIX times, in days, does not fit in int");
  int64_t timediff = time_to - time_from;
  int64_t daydiff = timediff / SECS_PER_DAY;
  timediff %= SECS_PER_DAY;
  *out_secs = (int)timediff;
  *out_days = (int)daydiff;
  return 1;
}